

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

bool __thiscall
Js::ES5Array::GetSetterBuiltIns
          (ES5Array *this,PropertyId propertyId,PropertyValueInfo *info,DescriptorFlags *result)

{
  bool bVar1;
  DescriptorFlags DVar2;
  DescriptorFlags *result_local;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  ES5Array *this_local;
  
  if (propertyId == 0xd1) {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    bVar1 = IsLengthWritable(this);
    DVar2 = Data;
    if (bVar1) {
      DVar2 = WritableData;
    }
    *result = DVar2;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ES5Array::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* result)
    {
        if (propertyId == PropertyIds::length)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *result =  IsLengthWritable() ? WritableData : Data;
            return true;
        }

        return false;
    }